

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall IRBuilder::BuildAuxNoReg(IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  Opnd *newSrc;
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  undefined4 *puVar4;
  OpLayoutAuxNoReg *pOVar5;
  JITTimeFunctionBody *pJVar6;
  RegOpnd *src1Opnd;
  RegOpnd *pRVar7;
  AddrOpnd *src1Opnd_00;
  RegOpnd *pRVar8;
  Instr *pIVar9;
  HelperCallOpnd *newSrc_00;
  
  bVar2 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1425,"(!OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "!OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar2) goto LAB_0048e809;
    *puVar4 = 0;
  }
  pOVar5 = Js::ByteCodeReader::AuxNoReg(&this->m_jnReader);
  if (newOpcode == InitCachedFuncs) {
    pJVar6 = Func::GetJITFunctionBody(this->m_func);
    RVar3 = JITTimeFunctionBody::GetLocalClosureReg(pJVar6);
    src1Opnd = BuildSrcOpnd(this,RVar3,TyVar);
    pJVar6 = Func::GetJITFunctionBody(this->m_func);
    RVar3 = JITTimeFunctionBody::GetLocalFrameDisplayReg(pJVar6);
    pRVar7 = BuildSrcOpnd(this,RVar3,TyVar);
    src1Opnd_00 = BuildAuxArrayOpnd(this,AuxFuncInfoArray,pOVar5->Offset);
    pRVar8 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar9 = IR::Instr::New(ArgOut_A,&pRVar8->super_Opnd,&src1Opnd_00->super_Opnd,this->m_func);
    AddInstr(this,pIVar9,offset);
    pRVar8 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar9 = IR::Instr::New(ArgOut_A,&pRVar8->super_Opnd,&pRVar7->super_Opnd,pIVar9->m_dst,
                            this->m_func);
    AddInstr(this,pIVar9,0xffffffff);
    pRVar7 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar9 = IR::Instr::New(ArgOut_A,&pRVar7->super_Opnd,&src1Opnd->super_Opnd,pIVar9->m_dst,
                            this->m_func);
    AddInstr(this,pIVar9,0xffffffff);
    newSrc_00 = IR::HelperCallOpnd::New(HelperOP_InitCachedFuncs,this->m_func);
    newSrc = pIVar9->m_dst;
    pIVar9 = IR::Instr::New(CallHelper,this->m_func);
    IR::Instr::SetSrc1(pIVar9,&newSrc_00->super_Opnd);
    IR::Instr::SetSrc2(pIVar9,newSrc);
    AddInstr(this,pIVar9,0xffffffff);
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                     ,0x144a,"((0))","Unknown AuxNoReg opcode");
  if (bVar2) {
    *puVar4 = 0;
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
LAB_0048e809:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void
IRBuilder::BuildAuxNoReg(Js::OpCode newOpcode, uint32 offset)
{
    Assert(!OpCodeAttr::HasMultiSizeLayout(newOpcode));

    IR::Instr * instr;
    const unaligned Js::OpLayoutAuxNoReg *auxInsn = m_jnReader.AuxNoReg();

    switch (newOpcode)
    {
        case Js::OpCode::InitCachedFuncs:
        {
            IR::Opnd   *src1Opnd = this->BuildSrcOpnd(m_func->GetJITFunctionBody()->GetLocalClosureReg());
            IR::Opnd   *src2Opnd = this->BuildSrcOpnd(m_func->GetJITFunctionBody()->GetLocalFrameDisplayReg());
            IR::Opnd   *src3Opnd = this->BuildAuxArrayOpnd(AuxArrayValue::AuxFuncInfoArray, auxInsn->Offset);

            instr = IR::Instr::New(Js::OpCode::ArgOut_A, IR::RegOpnd::New(TyVar, m_func), src3Opnd, m_func);
            this->AddInstr(instr, offset);

            instr = IR::Instr::New(Js::OpCode::ArgOut_A, IR::RegOpnd::New(TyVar, m_func), src2Opnd, instr->GetDst(), m_func);
            this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

            instr = IR::Instr::New(Js::OpCode::ArgOut_A, IR::RegOpnd::New(TyVar, m_func), src1Opnd, instr->GetDst(), m_func);
            this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

            IR::HelperCallOpnd *helperOpnd;

            helperOpnd = IR::HelperCallOpnd::New(IR::HelperOP_InitCachedFuncs, this->m_func);
            src2Opnd = instr->GetDst();

            instr = IR::Instr::New(Js::OpCode::CallHelper, m_func);
            instr->SetSrc1(helperOpnd);
            instr->SetSrc2(src2Opnd);
            this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

            return;
        }

        default:
        {
            AssertMsg(UNREACHED, "Unknown AuxNoReg opcode");
            Fatal();
            break;
        }
    }
}